

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

void __thiscall
re2::NFA::AddToThreadq(NFA *this,Threadq *q,int id0,int c,int flag,char *p,Thread *t0)

{
  AddState *pAVar1;
  bool bVar2;
  InstOp IVar3;
  int iVar4;
  EmptyOp EVar5;
  AddState *pAVar6;
  ostream *poVar7;
  AddState local_2b8;
  AddState local_2a8;
  AddState local_298;
  AddState local_288;
  AddState local_278;
  AddState local_268;
  AddState local_258;
  AddState local_248;
  AddState local_238 [2];
  LogMessage local_218;
  Inst *local_98;
  Inst *ip;
  Thread *t;
  iterator iStack_80;
  int j;
  pointer local_78;
  Thread **tp;
  int local_64;
  undefined1 auStack_60 [4];
  int id;
  AddState a;
  Thread *local_48;
  int local_3c;
  int nstk;
  AddState *stk;
  char *p_local;
  int flag_local;
  int c_local;
  int id0_local;
  Threadq *q_local;
  NFA *this_local;
  
  if (id0 != 0) {
    pAVar1 = this->astack_;
    AddState::AddState((AddState *)&a.t,id0);
    local_3c = 1;
    *(Thread **)pAVar1 = a.t;
    pAVar1->t = local_48;
LAB_00172228:
    if (0 < local_3c) {
      if (this->nastack_ < local_3c) {
        __assert_fail("(nstk) <= (nastack_)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                      0xd8,
                      "void re2::NFA::AddToThreadq(Threadq *, int, int, int, const char *, Thread *)"
                     );
      }
      local_3c = local_3c + -1;
      pAVar6 = pAVar1 + local_3c;
      auStack_60 = (undefined1  [4])pAVar6->id;
      id = *(int *)&pAVar6->field_0x4;
      a._0_8_ = pAVar6->t;
LAB_0017228b:
      if (a._0_8_ != 0) {
        Decref(this,t0);
        t0 = (Thread *)a._0_8_;
      }
      local_64 = (int)auStack_60;
      if ((auStack_60 == (undefined1  [4])0x0) ||
         (bVar2 = SparseArray<re2::NFA::Thread_*>::has_index(q,(int)auStack_60), bVar2))
      goto LAB_00172228;
      tp = (Thread **)SparseArray<re2::NFA::Thread_*>::set_new(q,local_64,(Thread *)0x0);
      iStack_80 = SparseArray<re2::NFA::Thread_*>::find(q,local_64);
      local_78 = __gnu_cxx::
                 __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
                 ::operator->(&stack0xffffffffffffff80);
      local_98 = Prog::inst(this->prog_,local_64);
      IVar3 = Prog::Inst::opcode(local_98);
      switch(IVar3) {
      case kInstAltMatch:
        ip = (Inst *)Incref(this,t0);
        local_78->second = (Thread *)ip;
        iVar4 = Prog::Inst::last(local_98);
        if (iVar4 != 0) {
          __assert_fail("!ip->last()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                        ,0x102,
                        "void re2::NFA::AddToThreadq(Threadq *, int, int, int, const char *, Thread *)"
                       );
        }
        AddState::AddState(local_238,local_64 + 1);
        auStack_60 = (undefined1  [4])local_238[0].id;
        id = local_238[0]._4_4_;
        a._0_8_ = local_238[0].t;
        goto LAB_0017228b;
      case kInstByteRange:
        bVar2 = Prog::Inst::Matches(local_98,c);
        if (bVar2) goto switchD_00172350_caseD_5;
        break;
      case kInstCapture:
        iVar4 = Prog::Inst::last(local_98);
        if (iVar4 == 0) {
          AddState::AddState(&local_268,local_64 + 1);
          pAVar6 = pAVar1 + local_3c;
          pAVar6->id = local_268.id;
          *(undefined4 *)&pAVar6->field_0x4 = local_268._4_4_;
          pAVar6->t = local_268.t;
          local_3c = local_3c + 1;
        }
        t._4_4_ = Prog::Inst::cap(local_98);
        if (t._4_4_ < this->ncapture_) {
          AddState::AddState(&local_278,0,t0);
          pAVar6 = pAVar1 + local_3c;
          pAVar6->id = local_278.id;
          *(undefined4 *)&pAVar6->field_0x4 = local_278._4_4_;
          pAVar6->t = local_278.t;
          ip = (Inst *)AllocThread(this);
          CopyCapture(this,((Thread *)ip)->capture,t0->capture);
          *(char **)((long)ip[1] + (long)t._4_4_ * 8) = p;
          t0 = (Thread *)ip;
          local_3c = local_3c + 1;
        }
        iVar4 = Prog::Inst::out(local_98);
        AddState::AddState(&local_288,iVar4);
        auStack_60 = (undefined1  [4])local_288.id;
        id = local_288._4_4_;
        a._0_8_ = local_288.t;
        goto LAB_0017228b;
      case kInstEmptyWidth:
        iVar4 = Prog::Inst::last(local_98);
        if (iVar4 == 0) {
          AddState::AddState(&local_2a8,local_64 + 1);
          pAVar6 = pAVar1 + local_3c;
          pAVar6->id = local_2a8.id;
          *(undefined4 *)&pAVar6->field_0x4 = local_2a8._4_4_;
          pAVar6->t = local_2a8.t;
          local_3c = local_3c + 1;
        }
        EVar5 = Prog::Inst::empty(local_98);
        if ((EVar5 & (flag ^ 0xffffffff)) != 0) goto LAB_00172228;
        iVar4 = Prog::Inst::out(local_98);
        AddState::AddState(&local_2b8,iVar4);
        auStack_60 = (undefined1  [4])local_2b8.id;
        id = local_2b8._4_4_;
        a._0_8_ = local_2b8.t;
        goto LAB_0017228b;
      case kInstMatch:
switchD_00172350_caseD_5:
        ip = (Inst *)Incref(this,t0);
        local_78->second = (Thread *)ip;
        break;
      case kInstNop:
        goto switchD_00172350_caseD_6;
      case kInstFail:
        goto LAB_00172228;
      default:
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                   0xf7);
        poVar7 = LogMessage::stream(&local_218);
        poVar7 = std::operator<<(poVar7,"unhandled ");
        IVar3 = Prog::Inst::opcode(local_98);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,IVar3);
        std::operator<<(poVar7," in AddToThreadq");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_218);
        goto LAB_00172228;
      }
      iVar4 = Prog::Inst::last(local_98);
      if (iVar4 != 0) goto LAB_00172228;
      AddState::AddState(&local_298,local_64 + 1);
      auStack_60 = (undefined1  [4])local_298.id;
      id = local_298._4_4_;
      a._0_8_ = local_298.t;
      goto LAB_0017228b;
    }
  }
  return;
switchD_00172350_caseD_6:
  iVar4 = Prog::Inst::last(local_98);
  if (iVar4 == 0) {
    AddState::AddState(&local_248,local_64 + 1);
    pAVar6 = pAVar1 + local_3c;
    pAVar6->id = local_248.id;
    *(undefined4 *)&pAVar6->field_0x4 = local_248._4_4_;
    pAVar6->t = local_248.t;
    local_3c = local_3c + 1;
  }
  iVar4 = Prog::Inst::out(local_98);
  AddState::AddState(&local_258,iVar4);
  auStack_60 = (undefined1  [4])local_258.id;
  id = local_258._4_4_;
  a._0_8_ = local_258.t;
  goto LAB_0017228b;
}

Assistant:

void NFA::AddToThreadq(Threadq* q, int id0, int c, int flag,
                       const char* p, Thread* t0) {
  if (id0 == 0)
    return;

  // Use astack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   two entries per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  AddState* stk = astack_;
  int nstk = 0;

  stk[nstk++] = AddState(id0);
  while (nstk > 0) {
    DCHECK_LE(nstk, nastack_);
    AddState a = stk[--nstk];

  Loop:
    if (a.t != NULL) {
      // t0 was a thread that we allocated and copied in order to
      // record the capture, so we must now decref it.
      Decref(t0);
      t0 = a.t;
    }

    int id = a.id;
    if (id == 0)
      continue;
    if (q->has_index(id)) {
      if (Debug)
        fprintf(stderr, "  [%d%s]\n", id, FormatCapture(t0->capture).c_str());
      continue;
    }

    // Create entry in q no matter what.  We might fill it in below,
    // or we might not.  Even if not, it is necessary to have it,
    // so that we don't revisit id0 during the recursion.
    q->set_new(id, NULL);

    Thread** tp = &q->find(id)->second;
    int j;
    Thread* t;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
    default:
      LOG(DFATAL) << "unhandled " << ip->opcode() << " in AddToThreadq";
      break;

    case kInstFail:
      break;

    case kInstAltMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      DCHECK(!ip->last());
      a = AddState(id+1);
      goto Loop;

    case kInstNop:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      // Continue on.
      a = AddState(ip->out());
      goto Loop;

    case kInstCapture:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      if ((j=ip->cap()) < ncapture_) {
        // Push a dummy whose only job is to restore t0
        // once we finish exploring this possibility.
        stk[nstk++] = AddState(0, t0);

        // Record capture.
        t = AllocThread();
        CopyCapture(t->capture, t0->capture);
        t->capture[j] = p;
        t0 = t;
      }
      a = AddState(ip->out());
      goto Loop;

    case kInstByteRange:
      if (!ip->Matches(c))
        goto Next;
      // Fallthrough intended.

    case kInstMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;
      if (Debug)
        fprintf(stderr, " + %d%s\n", id, FormatCapture(t0->capture).c_str());

    Next:
      if (ip->last())
        break;
      a = AddState(id+1);
      goto Loop;

    case kInstEmptyWidth:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      // Continue on if we have all the right flag bits.
      if (ip->empty() & ~flag)
        break;
      a = AddState(ip->out());
      goto Loop;
    }
  }
}